

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall FxClassPtrCast::FxClassPtrCast(FxClassPtrCast *this,PClass *dtype,FxExpression *x)

{
  PClassPointer *pPVar1;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&x->ScriptPosition);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_ClassPtrCast;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxClassPtrCast_0070d168;
  pPVar1 = NewClassPointer(dtype);
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  this->desttype = dtype;
  this->basex = x;
  return;
}

Assistant:

FxClassPtrCast::FxClassPtrCast(PClass *dtype, FxExpression *x)
	: FxExpression(EFX_ClassPtrCast, x->ScriptPosition)
{
	ValueType = NewClassPointer(dtype);
	desttype = dtype;
	basex = x;
}